

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int __thiscall
s2pred::TriageCompareSin2Distances<long_double>
          (s2pred *this,Vector3<long_double> *x,Vector3<long_double> *a,Vector3<long_double> *b)

{
  longdouble in_ST0;
  longdouble in_ST1;
  int local_8c;
  longdouble error;
  longdouble diff;
  longdouble sin2_bx;
  longdouble sin2_ax;
  longdouble sin2_bx_error;
  longdouble sin2_ax_error;
  Vector3<long_double> *local_20;
  Vector3<long_double> *b_local;
  Vector3<long_double> *a_local;
  Vector3<long_double> *x_local;
  
  local_20 = a;
  b_local = x;
  a_local = (Vector3<long_double> *)this;
  GetSin2Distance((longdouble *)x,(Vector3_ld *)this,(Vector3_ld *)((long)&sin2_bx_error + 8),
                  (longdouble *)b);
  GetSin2Distance((longdouble *)local_20,a_local,(Vector3_ld *)((long)&sin2_ax + 8),(longdouble *)b)
  ;
  if (in_ST0 - in_ST1 <= stack0xffffffffffffffb8 + stack0xffffffffffffffc8) {
    local_8c = -(uint)(in_ST0 - in_ST1 < -(stack0xffffffffffffffb8 + stack0xffffffffffffffc8));
  }
  else {
    local_8c = 1;
  }
  return local_8c;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}